

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  lua_State *L_00;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *p;
  lua_Integer lVar7;
  char *e;
  char *pcVar8;
  ushort **ppuVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar13;
  size_t lp;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  long local_22c0;
  size_t local_22b0;
  ulong local_22a8;
  lua_State *local_22a0;
  char *local_2298;
  size_t local_2290;
  ulong local_2288;
  size_t local_2280;
  MatchState local_2278;
  luaL_Buffer local_2050;
  ulong uVar12;
  
  pcVar6 = luaL_checklstring(L,1,&local_2280);
  p = luaL_checklstring(L,2,&local_22b0);
  uVar4 = lua_type(L,3);
  lVar7 = luaL_optinteger(L,4,local_2280 + 1);
  cVar1 = *p;
  bVar13 = cVar1 != '^';
  local_2288 = (ulong)uVar4;
  if (3 < uVar4 - 3) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&local_2050);
  if (cVar1 == '^') {
    p = p + 1;
    local_22b0 = local_22b0 - 1;
  }
  local_2278.matchdepth = 200;
  local_2278.src_end = pcVar6 + local_2280;
  local_2278.p_end = p + local_22b0;
  pcVar10 = (char *)0x0;
  local_22c0 = 0;
  local_22a0 = L;
  local_2298 = p;
  local_2278.src_init = pcVar6;
  local_2278.L = L;
  do {
    e = pcVar6;
    if (lVar7 <= local_22c0) break;
    local_2278.level = '\0';
    e = match(&local_2278,pcVar6,p);
    L_00 = local_2278.L;
    bVar3 = bVar13;
    if (e == pcVar10 || e == (char *)0x0) {
      if (pcVar6 < local_2278.src_end) {
        if (local_2050.size <= local_2050.n) {
          luaL_prepbuffsize(&local_2050,1);
        }
        local_2050.b[local_2050.n] = *pcVar6;
        e = pcVar6 + 1;
        local_2050.n = local_2050.n + 1;
      }
      else {
        e = pcVar6;
        bVar3 = false;
      }
    }
    else {
      local_22c0 = local_22c0 + 1;
      pcVar10 = e;
      if ((int)local_2288 == 5) {
        push_onecapture(&local_2278,0,pcVar6,e);
        lua_gettable(L_00,3);
      }
      else {
        if ((int)local_2288 != 6) {
          pcVar8 = lua_tolstring(local_2278.L,3,&local_22a8);
          p = local_2298;
          if (local_22a8 != 0) {
            local_2290 = (long)e - (long)pcVar6;
            uVar11 = 0;
            do {
              if (pcVar8[uVar11] == '%') {
                uVar12 = uVar11 + 1;
                ppuVar9 = __ctype_b_loc();
                bVar2 = pcVar8[uVar11 + 1];
                if ((*(byte *)((long)*ppuVar9 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                  if (bVar2 != 0x25) {
                    luaL_error(L_00,"invalid use of \'%c\' in replacement string",0x25);
                  }
                  if (local_2050.size <= local_2050.n) {
                    luaL_prepbuffsize(&local_2050,1);
                  }
                  local_2050.b[local_2050.n] = pcVar8[uVar12];
                  local_2050.n = local_2050.n + 1;
                }
                else if (bVar2 == 0x30) {
                  luaL_addlstring(&local_2050,pcVar6,local_2290);
                }
                else {
                  push_onecapture(&local_2278,(char)bVar2 + -0x31,pcVar6,e);
                  luaL_tolstring(L_00,-1,(size_t *)0x0);
                  lua_rotate(L_00,-2,-1);
                  lua_settop(L_00,-2);
                  luaL_addvalue(&local_2050);
                }
              }
              else {
                if (local_2050.size <= local_2050.n) {
                  luaL_prepbuffsize(&local_2050,1);
                }
                local_2050.b[local_2050.n] = pcVar8[uVar11];
                uVar12 = uVar11;
                local_2050.n = local_2050.n + 1;
              }
              uVar11 = uVar12 + 1;
              p = local_2298;
            } while (uVar11 < local_22a8);
          }
          goto LAB_0011669d;
        }
        lua_pushvalue(local_2278.L,3);
        iVar5 = push_captures(&local_2278,pcVar6,e);
        lua_callk(L_00,iVar5,1,0,(lua_KFunction)0x0);
      }
      iVar5 = lua_toboolean(L_00,-1);
      if (iVar5 == 0) {
        lua_settop(L_00,-2);
        lua_pushlstring(L_00,pcVar6,(long)e - (long)pcVar6);
      }
      else {
        iVar5 = lua_isstring(L_00,-1);
        if (iVar5 == 0) {
          iVar5 = lua_type(L_00,-1);
          pcVar6 = lua_typename(L_00,iVar5);
          luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
        }
      }
      luaL_addvalue(&local_2050);
    }
LAB_0011669d:
    pcVar6 = e;
  } while (bVar3);
  luaL_addlstring(&local_2050,e,(long)local_2278.src_end - (long)e);
  luaL_pushresult(&local_2050);
  lua_pushinteger(local_22a0,local_22c0);
  return 2;
}

Assistant:

static int str_gsub(lua_State *L) {
    size_t srcl, lp;
    const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
    const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
    const char *lastmatch = NULL;  /* end of last match */
    int tr = lua_type(L, 3);  /* replacement type */
    lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
    int anchor = (*p == '^');
    lua_Integer n = 0;  /* replacement count */
    MatchState ms;
    luaL_Buffer b;
    luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                     tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                  "string/function/table expected");
    luaL_buffinit(L, &b);
    if (anchor) {
        p++;
        lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, src, srcl, p, lp);
    while (n < max_s) {
        const char *e;
        reprepstate(&ms);  /* (re)prepare state for new match */
        if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
            n++;
            add_value(&ms, &b, src, e, tr);  /* add replacement to buffer */
            src = lastmatch = e;
        } else if (src < ms.src_end)  /* otherwise, skip one character */
            luaL_addchar(&b, *src++);
        else break;  /* end of subject */
        if (anchor) break;
    }
    luaL_addlstring(&b, src, ms.src_end - src);
    luaL_pushresult(&b);
    lua_pushinteger(L, n);  /* number of substitutions */
    return 2;
}